

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_REMOVE_CURSE(effect_handler_context_t_conflict *context)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  player_upkeep *ppVar6;
  object *obj_00;
  _Bool _Var7;
  int16_t iVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  uint32_t uVar11;
  int iVar12;
  char *pcVar13;
  int iVar14;
  _Bool none_left;
  wchar_t index;
  object *obj;
  char dice_string [20];
  object *destroyed;
  char o_name [80];
  _Bool local_b5;
  wchar_t local_b4;
  object *local_b0;
  char local_a8 [24];
  object *local_90;
  char local_88 [88];
  
  wVar9 = effect_calculate_value(context,false);
  local_b0 = (object *)0x0;
  context->ident = true;
  if (context->cmd == (command *)0x0) {
    _Var7 = get_item(&local_b0,"Uncurse which item? ","You have no curses to remove.",CMD_NULL,
                     item_tester_uncursable,L'\x0f');
    if (!_Var7) {
      return false;
    }
  }
  else {
    wVar10 = cmd_get_item((command_conflict *)context->cmd,"tgtitem",&local_b0,
                          "Uncurse which item? ","You have no curses to remove.",
                          item_tester_uncursable,L'\x0f');
    if (wVar10 != L'\0') {
      return false;
    }
  }
  uVar3 = (context->value).dice;
  if (uVar3 == 0) {
LAB_0013e1fb:
    uVar3 = (context->value).base;
    pcVar13 = "%d";
  }
  else {
    if ((uVar3 == 1) && (uVar4 = (context->value).base, uVar4 != 0)) {
      uVar5 = (context->value).sides;
      pcVar13 = "%d+d%d";
      uVar3 = uVar4;
LAB_0013e1ab:
      strnfmt(local_a8,0x14,pcVar13,(ulong)uVar3,(ulong)uVar5);
      goto LAB_0013e217;
    }
    uVar4 = (context->value).base;
    if (uVar4 != 0) {
      strnfmt(local_a8,0x14,"%d+%dd%d",(ulong)uVar4,(ulong)uVar3,(ulong)(uint)(context->value).sides
             );
      goto LAB_0013e217;
    }
    if (uVar3 == 0) goto LAB_0013e1fb;
    if (uVar3 != 1) {
      uVar5 = (context->value).sides;
      pcVar13 = "%dd%d";
      goto LAB_0013e1ab;
    }
    uVar3 = (context->value).sides;
    pcVar13 = "d%d";
  }
  strnfmt(local_a8,0x14,pcVar13,(ulong)uVar3);
LAB_0013e217:
  obj_00 = local_b0;
  local_b4 = L'\0';
  bVar2 = local_b0->number;
  iVar8 = object_weight_one(local_b0);
  _Var7 = get_curse(&local_b4,obj_00,local_a8);
  if (_Var7) {
    iVar14 = (int)iVar8 * (uint)bVar2;
    wVar10 = obj_00->curses[local_b4].power;
    iVar12 = iVar14;
    if (wVar10 < L'd') {
      if (wVar9 < wVar10) {
        _Var7 = flag_has_dbg(obj_00->flags,6,0x21,"obj->flags","OF_FRAGILE");
        if (_Var7) {
          uVar11 = Rand_div(4);
          if (uVar11 == 0) {
            local_b5 = false;
            wVar9 = damroll(5,5);
            local_88[0] = '\0';
            local_88[1] = '\0';
            local_88[2] = '\0';
            local_88[3] = '\0';
            local_88[4] = '\0';
            local_88[5] = '\0';
            local_88[6] = '\0';
            local_88[7] = '\0';
            local_88[8] = '\0';
            local_88[9] = '\0';
            local_88[10] = '\0';
            local_88[0xb] = '\0';
            local_88[0xc] = '\0';
            local_88[0xd] = '\0';
            local_88[0xe] = '\0';
            local_88[0xf] = '\0';
            wVar9 = player_apply_damage_reduction(player,wVar9);
            if ((L'\0' < wVar9) && ((player->opts).opt[3] == true)) {
              strnfmt(local_88,0x10," (%d)");
            }
            msg("%s%s","There is a bang and a flash!",local_88);
            _Var7 = object_is_carried(player,obj_00);
            if (_Var7) {
              local_90 = gear_object_for_use(player,obj_00,L'\x01',false,&local_b5);
              if (local_90->artifact != (artifact *)0x0) {
                history_lose_artifact(player,local_90->artifact);
              }
              object_delete((chunk *)player->cave,(chunk *)0x0,&local_90->known);
              object_delete((chunk *)cave,(chunk *)player->cave,&local_90);
            }
            else {
              square_delete_object(cave,obj_00->grid,obj_00,true,true);
            }
            take_hit(player,wVar9,"Failed uncursing");
          }
          else {
            msg("The removal fails.");
          }
        }
        else {
          object_desc(local_88,0x50,obj_00,3,player);
          msgt(0x82,"The spell fails; your %s is now fragile.",local_88);
          flag_on_dbg(obj_00->flags,6,0x21,"obj->flags","OF_FRAGILE");
          player_learn_flag(player,L'!');
        }
      }
      else {
        remove_object_curse(obj_00->known,local_b4,false);
        remove_object_curse(obj_00,local_b4,true);
        bVar2 = obj_00->number;
        iVar8 = object_weight_one(obj_00);
        iVar12 = (int)iVar8 * (uint)bVar2;
      }
    }
    if (wVar10 < L'd') {
      ppVar6 = player->upkeep;
      ppVar6->total_weight = ppVar6->total_weight + (iVar12 - iVar14);
      *(byte *)&ppVar6->notice = (byte)ppVar6->notice | 1;
      *(byte *)&ppVar6->update = (byte)ppVar6->update | 1;
      pbVar1 = (byte *)((long)&ppVar6->redraw + 2);
      *pbVar1 = *pbVar1 | 6;
      return true;
    }
  }
  return false;
}

Assistant:

bool effect_handler_REMOVE_CURSE(effect_handler_context_t *context)
{
	const char *prompt = "Uncurse which item? ";
	const char *rejmsg = "You have no curses to remove.";
	int itemmode = (USE_EQUIP | USE_INVEN | USE_QUIVER | USE_FLOOR);
	int strength = effect_calculate_value(context, false);
	struct object *obj = NULL;
	char dice_string[20];

	context->ident = true;

	if (context->cmd) {
		if (cmd_get_item(context->cmd, "tgtitem", &obj, prompt,
				rejmsg, item_tester_uncursable, itemmode)) {
			return false;
		}
	} else if (!get_item(&obj, prompt, rejmsg, 0, item_tester_uncursable,
			itemmode))
		return false;

	/* Get the possible dice strings */
	if ((context->value.dice == 1) && context->value.base) {
		strnfmt(dice_string, sizeof(dice_string), "%d+d%d",
				context->value.base, context->value.sides);
	} else if (context->value.dice && context->value.base) {
		strnfmt(dice_string, sizeof(dice_string), "%d+%dd%d",
				context->value.base, context->value.dice, context->value.sides);
	} else if (context->value.dice == 1) {
		strnfmt(dice_string, sizeof(dice_string), "d%d", context->value.sides);
	} else if (context->value.dice) {
		strnfmt(dice_string, sizeof(dice_string), "%dd%d",
				context->value.dice, context->value.sides);
	} else {
		strnfmt(dice_string, sizeof(dice_string), "%d", context->value.base);
	}

	return uncurse_object(obj, strength, dice_string);
}